

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::WriteEquals
          (WrapperFieldGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  FieldDescriptor *pFVar2;
  size_t sVar3;
  char *__s;
  string_view text;
  
  pDVar1 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
  pFVar2 = Descriptor::field(pDVar1,0);
  if (pFVar2[2] == (FieldDescriptor)0x2) {
    __s = 
    "if (!pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n"
    ;
  }
  else {
    pDVar1 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
    pFVar2 = Descriptor::field(pDVar1,0);
    __s = "if ($property_name$ != other.$property_name$) return false;\n";
    if (pFVar2[2] == (FieldDescriptor)0x1) {
      __s = 
      "if (!pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n"
      ;
    }
  }
  sVar3 = strlen(__s);
  text._M_str = __s;
  text._M_len = sVar3;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_FieldGeneratorBase).variables_,text);
  return;
}

Assistant:

void WrapperFieldGenerator::WriteEquals(io::Printer* printer) {
  const char *text = "if ($property_name$ != other.$property_name$) return false;\n";
  if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_FLOAT) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  }
  else if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_DOUBLE) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  }
  printer->Print(variables_, text);
}